

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QStringList * __thiscall QRegularExpressionMatch::capturedTexts(QRegularExpressionMatch *this)

{
  long lVar1;
  QRegularExpressionMatchPrivate *pQVar2;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  int i;
  QStringList *texts;
  rvalue_ref in_stack_ffffffffffffff88;
  QList<QString> *in_stack_ffffffffffffff90;
  int nth;
  int local_48;
  QStringList *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x730689);
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::operator->
            ((QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)0x730693);
  QList<QString>::reserve(this_00,in_stack_00000018);
  local_48 = 0;
  while (nth = local_48,
        pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)0x7306bd
                           ), nth < pQVar2->capturedCount) {
    captured((QRegularExpressionMatch *)in_RDI,nth);
    QList<QString>::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QString::~QString((QString *)0x7306f9);
    local_48 = local_48 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QRegularExpressionMatch::capturedTexts() const
{
    QStringList texts;
    texts.reserve(d->capturedCount);
    for (int i = 0; i < d->capturedCount; ++i)
        texts << captured(i);
    return texts;
}